

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O2

bool __thiscall reflection::RPCCall::Verify(RPCCall *this,Verifier *verifier)

{
  bool bVar1;
  String *str;
  Object *pOVar2;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *pVVar3;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *pVVar4;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>(&this->super_Table,verifier,4),
     bVar1)) {
    str = name(this);
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,str);
    if ((bVar1) &&
       (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>
                          (&this->super_Table,verifier,6), bVar1)) {
      pOVar2 = request(this);
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTable<reflection::Object>(verifier,pOVar2)
      ;
      if ((bVar1) &&
         (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>
                            (&this->super_Table,verifier,8), bVar1)) {
        pOVar2 = response(this);
        bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTable<reflection::Object>
                          (verifier,pOVar2);
        if ((bVar1) &&
           (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,10),
           bVar1)) {
          pVVar3 = attributes(this);
          bVar1 = flatbuffers::VerifierTemplate<false>::
                  VerifyVector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>
                            (verifier,pVVar3);
          if (bVar1) {
            pVVar3 = attributes(this);
            bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::KeyValue>
                              (verifier,pVVar3);
            if ((bVar1) &&
               (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                  (&this->super_Table,verifier,0xc), bVar1)) {
              pVVar4 = documentation(this);
              bVar1 = flatbuffers::VerifierTemplate<false>::
                      VerifyVector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>
                                (verifier,pVVar4);
              if (bVar1) {
                pVVar4 = documentation(this);
                bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfStrings(verifier,pVVar4)
                ;
                if (bVar1) {
                  verifier->depth_ = verifier->depth_ - 1;
                  return true;
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffsetRequired(verifier, VT_NAME) &&
           verifier.VerifyString(name()) &&
           VerifyOffsetRequired(verifier, VT_REQUEST) &&
           verifier.VerifyTable(request()) &&
           VerifyOffsetRequired(verifier, VT_RESPONSE) &&
           verifier.VerifyTable(response()) &&
           VerifyOffset(verifier, VT_ATTRIBUTES) &&
           verifier.VerifyVector(attributes()) &&
           verifier.VerifyVectorOfTables(attributes()) &&
           VerifyOffset(verifier, VT_DOCUMENTATION) &&
           verifier.VerifyVector(documentation()) &&
           verifier.VerifyVectorOfStrings(documentation()) &&
           verifier.EndTable();
  }